

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setMaximumTime(QDateTimeEdit *this,QTime max)

{
  long lVar1;
  QDateTimeEditPrivate *dt;
  ulong uVar2;
  QTime in_ESI;
  QDateTimeEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDateTimeEditPrivate *this_00;
  QDate in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  dt = d_func((QDateTimeEdit *)0x55965e);
  uVar2 = QTime::isValid();
  if ((uVar2 & 1) != 0) {
    ::QVariant::toDate();
    QDateTimeEditPrivate::dateTimeValue(in_RDI,in_stack_ffffffffffffffe8,in_ESI);
    setMaximumDateTime((QDateTimeEdit *)this_00,(QDateTime *)dt);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setMaximumTime(QTime max)
{
    Q_D(QDateTimeEdit);
    if (max.isValid())
        setMaximumDateTime(d->dateTimeValue(d->maximum.toDate(), max));
}